

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wlcReadVer.c
# Opt level: O2

char * Wlc_PrsFindClosingParenthesis(char *pStr,char Open,char Close)

{
  int iVar1;
  char cVar2;
  bool bVar3;
  bool bVar4;
  
  if (*pStr != '(') {
    __assert_fail("*pStr == Open",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/base/wlc/wlcReadVer.c"
                  ,0xd2,"char *Wlc_PrsFindClosingParenthesis(char *, char, char)");
  }
  bVar3 = true;
  cVar2 = '(';
  iVar1 = 0;
  while( true ) {
    if (cVar2 == '\0') {
      return (char *)0x0;
    }
    if ((bVar3) && (iVar1 = (iVar1 + (uint)(cVar2 == '(')) - (uint)(cVar2 == ')'), iVar1 == 0))
    break;
    bVar4 = cVar2 == ' ';
    if (bVar3) {
      bVar4 = cVar2 != '\\';
    }
    bVar3 = bVar4;
    if (cVar2 == '\\') {
      bVar3 = cVar2 != '\\';
    }
    cVar2 = pStr[1];
    pStr = pStr + 1;
  }
  return pStr;
}

Assistant:

static inline char * Wlc_PrsFindClosingParenthesis( char * pStr, char Open, char Close )
{
    int Counter = 0;
    int fNotName = 1;
    assert( *pStr == Open );
    for ( ; *pStr; pStr++ )
    {
        if ( fNotName )
        {
            if ( *pStr == Open )
                Counter++;
            if ( *pStr == Close )
                Counter--;
            if ( Counter == 0 )
                return pStr;
        }
        if ( *pStr == '\\' )
            fNotName = 0;
        else if ( !fNotName && *pStr == ' ' )
            fNotName = 1;
    }
    return NULL;
}